

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<int> __thiscall Omega_h::array_cast<int,signed_char>(Omega_h *this,Read<signed_char> *in)

{
  void *extraout_RDX;
  Read<int> RVar1;
  Write<int> local_d0;
  undefined1 local_c0 [8];
  type f;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Write<int> out;
  Read<signed_char> *in_local;
  LO local_20;
  LO local_10;
  
  if (((ulong)(in->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (LO)((in->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (LO)((ulong)(in->write_).shared_alloc_.alloc >> 3);
  }
  out.shared_alloc_.direct_ptr = in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  Write<int>::Write((Write<int> *)local_68,local_10,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  Write<int>::Write((Write<int> *)local_c0,(Write<int> *)local_68);
  Read<signed_char>::Read((Read<signed_char> *)&f.out.shared_alloc_.direct_ptr,in);
  if (((ulong)(in->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = (LO)((in->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (LO)((ulong)(in->write_).shared_alloc_.alloc >> 3);
  }
  parallel_for<Omega_h::array_cast<int,signed_char>(Omega_h::Read<signed_char>)::_lambda(int)_1_>
            (local_20,(type *)local_c0,"array_cast");
  Write<int>::Write(&local_d0,(Write<int> *)local_68);
  Read<int>::Read((Read<int> *)this,&local_d0);
  Write<int>::~Write(&local_d0);
  array_cast<int,signed_char>(Omega_h::Read<signed_char>)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_c0);
  Write<int>::~Write((Write<int> *)local_68);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<Tout> array_cast(Read<Tin> in) {
  auto out = Write<Tout>(in.size());
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = static_cast<Tout>(in[i]); };
  parallel_for(in.size(), f, "array_cast");
  return out;
}